

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCallByName
          (ExpressionContext *ctx,SynBase *source,InplaceStr name,ArrayView<ArgumentData> arguments,
          bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  Allocator *pAVar1;
  FunctionData *function_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  InplaceStr functionName;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  uint uVar4;
  int iVar5;
  TypeBase *pTVar6;
  IdentifierLookupResult *pIVar7;
  ExprBase *pEVar8;
  SynBase *pSVar9;
  size_t sVar10;
  undefined4 extraout_var;
  ArgumentData *pAVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeBase *type;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  uint i;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<FunctionValue> functions_00;
  ArrayView<ArgumentData> arguments_local;
  InplaceStr name_local;
  FunctionLookupChain function;
  uint uStack_39c;
  uint uStack_38c;
  FunctionValue local_360;
  SmallArray<FunctionValue,_32U> functions;
  
  pAVar11 = arguments.data;
  pcVar14 = name.end;
  pcVar13 = name.begin;
  arguments_local.count = arguments.count;
  uVar15 = arguments._8_8_ & 0xffffffff;
  uVar12 = CONCAT71(name.end._1_7_,allowFastLookup);
  arguments_local.data = pAVar11;
  name_local.begin = pcVar13;
  name_local.end = pcVar14;
  if (allowFastLookup) {
    pTVar6 = anon_unknown.dwarf_ff84f::FindNextTypeFromScope(ctx->scope);
    if (pTVar6 != (TypeBase *)0x0) {
      uVar4 = NULLC::StringHashContinue(pTVar6->nameHash,"::");
      uVar4 = NULLC::StringHashContinue(uVar4,pcVar13,pcVar14);
      pIVar7 = anon_unknown.dwarf_ff84f::LookupObjectByName(ctx,uVar4);
      if ((((pIVar7 != (IdentifierLookupResult *)0x0) && (pIVar7->function != (FunctionData *)0x0))
          && (auVar2._8_8_ = 0, auVar2._0_8_ = uVar12,
             pEVar8 = CreateVariableAccess
                                (ctx,source,(IntrusiveList<SynIdentifier>)(auVar2 << 0x40),name,
                                 allowInternal), pEVar8 != (ExprBase *)0x0)) &&
         (arguments_02._8_8_ = uVar15, arguments_02.data = pAVar11,
         pEVar8 = CreateFunctionCall(ctx,source,pEVar8,arguments_02,allowFailure),
         pEVar8 != (ExprBase *)0x0)) {
        return pEVar8;
      }
    }
    uVar4 = InplaceStr::hash(&name_local);
    anon_unknown.dwarf_ff84f::LookupFunctionChainByName(&function,ctx,uVar4);
    if (function.node.node != (Node *)0x0) {
      pAVar1 = ctx->allocator;
      memset(functions.little,0,0x300);
      functions.count = 0;
      functions.max = 0x20;
      functions.data = functions.little;
      functions.allocator = pAVar1;
      while ((FunctionData *)function.node.node != (FunctionData *)0x0) {
        function_00 = *(FunctionData **)&((FunctionData *)function.node.node)->isInternal;
        pSVar9 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pEVar8 = CreateFunctionContextAccess
                           (ctx,pSVar9,
                            *(FunctionData **)&((FunctionData *)function.node.node)->isInternal);
        FunctionValue::FunctionValue(&local_360,source,function_00,pEVar8);
        SmallArray<FunctionValue,_32U>::push_back(&functions,&local_360);
        anon_unknown.dwarf_ff84f::FunctionLookupChain::next
                  ((FunctionLookupChain *)&local_360,&function);
        function.node.node = (Node *)local_360.function;
      }
      functions_00.count = functions.count;
      functions_00.data = functions.data;
      arguments_00._12_4_ = arguments_local._12_4_;
      arguments_00.count = arguments_local.count;
      arguments_00.data = arguments_local.data;
      functions_00._12_4_ = 0;
      pEVar8 = CreateFunctionCallFinal
                         (ctx,source,(ExprBase *)0x0,functions_00,
                          (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,true);
      SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
joined_r0x001cfb5e:
      if (pEVar8 != (ExprBase *)0x0 || allowFailure) {
        return pEVar8;
      }
      goto LAB_001cfce2;
    }
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar12;
    pEVar8 = CreateVariableAccess
                       (ctx,source,(IntrusiveList<SynIdentifier>)(auVar3 << 0x40),name,allowInternal
                       );
    if (pEVar8 != (ExprBase *)0x0) {
      arguments_03._8_8_ = uVar15;
      arguments_03.data = pAVar11;
      pEVar8 = CreateFunctionCall(ctx,source,pEVar8,arguments_03,allowFailure);
      goto joined_r0x001cfb5e;
    }
  }
  if (allowFailure) {
    return (ExprBase *)0x0;
  }
LAB_001cfce2:
  pcVar14 = ctx->errorBuf;
  if ((pcVar14 != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = (source->pos).begin;
      ctx->errorBufLocation = pcVar14;
      pcVar13 = pcVar14;
    }
    else {
      pcVar13 = ctx->errorBufLocation;
    }
    NULLC::SafeSprintf(pcVar13,(ulong)(ctx->errorBufSize + ((int)pcVar14 - (int)pcVar13)),
                       "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                       (ulong)(uint)((int)name_local.end - (int)name_local.begin));
    pcVar14 = ctx->errorBufLocation;
    sVar10 = strlen(pcVar14);
    pcVar14 = pcVar14 + sVar10;
    ctx->errorBufLocation = pcVar14;
    arguments_01._12_4_ = arguments_local._12_4_;
    arguments_01.count = arguments_local.count;
    functionName.end = name_local.end;
    functionName.begin = name_local.begin;
    arguments_01.data = arguments_local.data;
    ReportOnFunctionSelectError
              (ctx,source,pcVar14,(*(int *)&ctx->errorBuf - (int)pcVar14) + ctx->errorBufSize,
               pcVar13,functionName,(ArrayView<FunctionValue>)(ZEXT416(uStack_38c) << 0x60),
               (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_01,
               (ArrayView<unsigned_int>)(ZEXT416(uStack_39c) << 0x60),0xffffffff,true);
    pcVar14 = ctx->errorBufLocation;
    sVar10 = strlen(pcVar14);
    ctx->errorBufLocation = pcVar14 + sVar10;
  }
  if (ctx->errorHandlerNested != true) {
    ctx->errorCount = ctx->errorCount + 1;
    functions.data = (FunctionValue *)0x0;
    functions.count = 0;
    functions.max = 0;
    uVar4 = 0;
    while( true ) {
      pAVar1 = ctx->allocator;
      if ((uint)uVar15 <= uVar4) break;
      iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
      pAVar11 = ArrayView<ArgumentData>::operator[](&arguments_local,uVar4);
      pSVar9 = pAVar11->value->source;
      pAVar11 = ArrayView<ArgumentData>::operator[](&arguments_local,uVar4);
      pTVar6 = pAVar11->value->type;
      pAVar11 = ArrayView<ArgumentData>::operator[](&arguments_local,uVar4);
      ExprPassthrough::ExprPassthrough
                ((ExprPassthrough *)CONCAT44(extraout_var,iVar5),pSVar9,pTVar6,pAVar11->value);
      IntrusiveList<ExprBase>::push_back
                ((IntrusiveList<ExprBase> *)&functions,(ExprBase *)CONCAT44(extraout_var,iVar5));
      uVar4 = uVar4 + 1;
      uVar15 = (ulong)arguments_local.count;
    }
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x48);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError((ExprError *)CONCAT44(extraout_var_01,iVar5),source,type);
    pEVar8->typeID = 0x29;
    pEVar8->source = source;
    pEVar8->type = pTVar6;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3a98;
    pEVar8[1]._vptr_ExprBase = (_func_int **)CONCAT44(extraout_var_01,iVar5);
    *(FunctionValue **)&pEVar8[1].typeID = functions.data;
    pEVar8[1].source = (SynBase *)CONCAT44(functions.max,functions.count);
    return pEVar8;
  }
  if (ctx->errorHandlerActive == false) {
    __assert_fail("ctx.errorHandlerActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1c38,
                  "ExprBase *CreateFunctionCallByName(ExpressionContext &, SynBase *, InplaceStr, ArrayView<ArgumentData>, bool, bool, bool)"
                 );
  }
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

ExprBase* CreateFunctionCallByName(ExpressionContext &ctx, SynBase *source, InplaceStr name, ArrayView<ArgumentData> arguments, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	if(allowFastLookup)
	{
		if(TypeBase *nextType = FindNextTypeFromScope(ctx.scope))
		{
			unsigned hash = nextType->nameHash;

			hash = NULLC::StringHashContinue(hash, "::");
			hash = NULLC::StringHashContinue(hash, name.begin, name.end);

			if(LookupFunctionByName(ctx, hash))
			{
				if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
				{
					if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
						return result;
				}
			}
		}

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, name.hash()))
		{
			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			while(function)
			{
				functions.push_back(FunctionValue(source, *function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *function)));

				function = function.next();
			}

			if(ExprBase *result = CreateFunctionCallFinal(ctx, source, NULL, functions, IntrusiveList<TypeHandle>(), arguments, true))
				return result;
		}
	}
	else
	{
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
		{
			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
				return result;
		}
	}

	if(!allowFailure)
	{
		IntrusiveList<TypeHandle> generics;
		ArrayView<FunctionValue> functions;
		ArrayView<unsigned> ratings;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = source->pos.begin;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(name));

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, name, functions, generics, arguments, ratings, ~0u, true);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()), errorArguments);
	}

	return NULL;
}